

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

char * hts_format_description(htsFormat *format)

{
  ulong uVar1;
  htsCompression hVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  kstring_t local_38;
  
  local_38.s = (char *)0x0;
  local_38.l = 0;
  local_38.m = 0;
  switch(format->format) {
  case sam:
    pcVar6 = "SAM";
    break;
  case bam:
    pcVar6 = "BAM";
    break;
  case bai:
    pcVar6 = "BAI";
    break;
  case cram:
    pcVar6 = "CRAM";
    break;
  case crai:
    pcVar6 = "CRAI";
    break;
  case vcf:
    pcVar6 = "VCF";
    break;
  case bcf:
    pcVar6 = "BCF";
    if ((format->version).major == 1) {
      pcVar6 = "Legacy BCF";
    }
    break;
  case csi:
    pcVar6 = "CSI";
    break;
  default:
    pcVar6 = "unknown";
    break;
  case tbi:
    pcVar6 = "Tabix";
  }
  kputs(pcVar6,&local_38);
  if (-1 < (format->version).major) {
    kputs(" version ",&local_38);
    kputw((int)(format->version).major,&local_38);
    sVar3 = local_38.l;
    if (-1 < (format->version).minor) {
      uVar1 = local_38.l + 1;
      pcVar6 = local_38.s;
      if (uVar1 < local_38.m) {
LAB_00109cf9:
        local_38.s = pcVar6;
        (local_38.s + sVar3)[0] = '.';
        (local_38.s + sVar3)[1] = '\0';
        local_38.l = uVar1;
      }
      else {
        uVar5 = uVar1 >> 1 | uVar1;
        uVar5 = uVar5 >> 2 | uVar5;
        uVar5 = uVar5 >> 4 | uVar5;
        uVar5 = uVar5 >> 8 | uVar5;
        local_38.m = (uVar5 >> 0x10 | uVar5) + 1;
        pcVar6 = (char *)realloc(local_38.s,local_38.m);
        if (pcVar6 != (char *)0x0) goto LAB_00109cf9;
      }
      kputw((int)(format->version).minor,&local_38);
    }
  }
  hVar2 = format->compression;
  if (hVar2 == custom) {
    pcVar6 = " compressed";
  }
  else if (hVar2 == bgzf) {
    uVar4 = format->format - bam;
    if (uVar4 < 9) {
      pcVar6 = &DAT_0013a300 + *(int *)(&DAT_0013a300 + (ulong)uVar4 * 4);
    }
    else {
      pcVar6 = " BGZF-compressed";
    }
  }
  else {
    if (hVar2 != gzip) goto LAB_00109d60;
    pcVar6 = " gzip-compressed";
  }
  kputs(pcVar6,&local_38);
LAB_00109d60:
  uVar4 = format->category - sequence_data;
  if (uVar4 < 4) {
    kputs(&DAT_0013a324 + *(int *)(&DAT_0013a324 + (ulong)uVar4 * 4),&local_38);
  }
  pcVar6 = " data";
  if (((format->compression == no_compression) && (format->format < (tbi|text_format))) &&
     ((0x2188U >> (format->format & 0x1f) & 1) != 0)) {
    pcVar6 = " text";
  }
  kputs(pcVar6,&local_38);
  return local_38.s;
}

Assistant:

char *hts_format_description(const htsFormat *format)
{
    kstring_t str = { 0, 0, NULL };

    switch (format->format) {
    case sam:   kputs("SAM", &str); break;
    case bam:   kputs("BAM", &str); break;
    case cram:  kputs("CRAM", &str); break;
    case vcf:   kputs("VCF", &str); break;
    case bcf:
        if (format->version.major == 1) kputs("Legacy BCF", &str);
        else kputs("BCF", &str);
        break;
    case bai:   kputs("BAI", &str); break;
    case crai:  kputs("CRAI", &str); break;
    case csi:   kputs("CSI", &str); break;
    case tbi:   kputs("Tabix", &str); break;
    default:    kputs("unknown", &str); break;
    }

    if (format->version.major >= 0) {
        kputs(" version ", &str);
        kputw(format->version.major, &str);
        if (format->version.minor >= 0) {
            kputc('.', &str);
            kputw(format->version.minor, &str);
        }
    }

    switch (format->compression) {
    case custom: kputs(" compressed", &str); break;
    case gzip:   kputs(" gzip-compressed", &str); break;
    case bgzf:
        switch (format->format) {
        case bam:
        case bcf:
        case csi:
        case tbi:
            // These are by definition BGZF, so just use the generic term
            kputs(" compressed", &str);
            break;
        default:
            kputs(" BGZF-compressed", &str);
            break;
        }
        break;
    default: break;
    }

    switch (format->category) {
    case sequence_data: kputs(" sequence", &str); break;
    case variant_data:  kputs(" variant calling", &str); break;
    case index_file:    kputs(" index", &str); break;
    case region_list:   kputs(" genomic region", &str); break;
    default: break;
    }

    if (format->compression == no_compression)
        switch (format->format) {
        case sam:
        case crai:
        case vcf:
        case bed:
            kputs(" text", &str);
            break;

        default:
            kputs(" data", &str);
            break;
        }
    else
        kputs(" data", &str);

    return ks_release(&str);
}